

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTConstantExpression.cpp
# Opt level: O0

void __thiscall
MathML::AST::ConstantExpression::setValue(ConstantExpression *this,String *str,Type type)

{
  long lVar1;
  char *pcVar2;
  undefined4 in_EDX;
  ulong in_RSI;
  long in_RDI;
  bool bVar3;
  double dVar4;
  String *in_stack_00000160;
  undefined8 local_38;
  
  switch(in_EDX) {
  case 0:
    break;
  case 1:
    lVar1 = std::__cxx11::string::size();
    bVar3 = false;
    if (lVar1 != 0) {
      pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI);
      bVar3 = true;
      if (*pcVar2 != 'f') {
        pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI);
        bVar3 = *pcVar2 == 'F';
      }
    }
    local_38 = 0;
    if (!bVar3) {
      local_38 = 0x3ff0000000000000;
    }
    *(undefined8 *)(in_RDI + 0x10) = local_38;
    *(undefined4 *)(in_RDI + 8) = 1;
    break;
  case 2:
    lVar1 = StringUtil::parseLong(in_stack_00000160);
    *(double *)(in_RDI + 0x10) = (double)lVar1;
    *(undefined4 *)(in_RDI + 8) = 2;
    break;
  case 3:
    dVar4 = StringUtil::parseDouble(in_stack_00000160);
    *(double *)(in_RDI + 0x10) = dVar4;
    *(undefined4 *)(in_RDI + 8) = 3;
  }
  return;
}

Assistant:

void ConstantExpression::setValue( const String& str, Type type )
        {
            switch ( type )
            {

            case SCALAR_INVALID:
                break;

            case SCALAR_DOUBLE:
                mValue = StringUtil::parseDouble( str );
                mType = SCALAR_DOUBLE;
                //mValue = 1.0;
                break;

            case SCALAR_LONG:
                mValue = StringUtil::parseLong( str );
                mType = SCALAR_LONG;
                break;

            case SCALAR_BOOL:
                mValue = ( str.size() > 0 && ( str[ 0 ] == 'f' || str[ 0 ] == 'F' ) ) ? 0. : 1.;
                mType = SCALAR_BOOL;
                break;

            default:
                //@todo: exception
                break;
            }
        }